

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void constructAutomaticIndex(Parse *pParse,WhereClause *pWC,Bitmask notReady,WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  SrcItem *pSrc;
  u8 uVar3;
  short sVar4;
  Vdbe *p;
  SrcList *pSrcList;
  Table *pTVar5;
  WhereLoop *p_00;
  Subquery *pSVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int p3;
  Expr *pEVar13;
  Index *pIdx;
  CollSeq *pCVar14;
  WhereTerm *pWVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  Op *pOVar19;
  int regOut;
  WhereTerm *pWVar20;
  u16 *puVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  uint uVar25;
  uint uVar26;
  uint uVar28;
  ulong uVar27;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar33;
  ulong uVar32;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar41;
  uint uVar42;
  undefined1 auVar40 [16];
  uint uVar43;
  undefined1 auVar44 [16];
  ulong uVar45;
  ulong uVar46;
  Expr *local_b8;
  ulong local_b0;
  long local_70;
  ulong local_60;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  uVar26 = 0;
  iVar10 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  pWVar20 = pWC->a;
  pSrcList = pWC->pWInfo->pTabList;
  pSrc = pSrcList->a + pLevel->iFrom;
  pTVar5 = pSrc->pSTab;
  pWVar15 = pWVar20 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    local_b0 = 0;
    local_b8 = (Expr *)0x0;
  }
  else {
    uVar26 = 0;
    local_b8 = (Expr *)0x0;
    bVar7 = false;
    local_b0 = 0;
    do {
      if ((pWVar20->wtFlags & 2) == 0) {
        pEVar13 = pWVar20->pExpr;
        iVar11 = sqlite3ExprIsSingleTableConstraint(pEVar13,pSrcList,(uint)pLevel->iFrom,0);
        if (iVar11 != 0) {
          if (pEVar13 == (Expr *)0x0) {
            pEVar13 = (Expr *)0x0;
          }
          else {
            pEVar13 = exprDup(pParse->db,pEVar13,0,(EdupBuf *)0x0);
          }
          local_b8 = sqlite3ExprAnd(pParse,local_b8,pEVar13);
        }
      }
      iVar11 = termCanDriveIndex(pWVar20,pSrc,notReady);
      if (iVar11 != 0) {
        iVar11 = (pWVar20->u).x.leftColumn;
        uVar24 = 1L << ((byte)iVar11 & 0x3f);
        if (0x3f < iVar11) {
          uVar24 = 0x8000000000000000;
        }
        if (!bVar7) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar5->zName);
        }
        bVar7 = true;
        if ((local_b0 & uVar24) == 0) {
          iVar11 = whereLoopResize(pParse->db,p_00,uVar26 + 1);
          if (iVar11 != 0) goto LAB_001949f4;
          p_00->aLTerm[(int)uVar26] = pWVar20;
          local_b0 = local_b0 | uVar24;
          uVar26 = uVar26 + 1;
        }
      }
      pWVar20 = pWVar20 + 1;
    } while (pWVar20 < pWVar15);
  }
  p_00->nLTerm = (u16)uVar26;
  (p_00->u).btree.nEq = (u16)uVar26;
  p_00->wsFlags = 0x4241;
  if (pTVar5->eTabType == '\x02') {
    uVar24 = ~local_b0;
  }
  else {
    uVar24 = (~local_b0 | 0x8000000000000000) & pSrc->colUsed;
  }
  sVar4 = pTVar5->nCol;
  uVar18 = (uint)sVar4;
  cVar8 = (char)pTVar5->tabFlags;
  if (cVar8 < '\0') {
    if (0 < sVar4) {
      puVar21 = &pTVar5->aCol->colFlags;
      uVar16 = 0;
      do {
        if ((*puVar21 & 1) != 0) {
          if (0x3e < uVar16) {
            uVar24 = uVar24 | 0x8000000000000000;
            break;
          }
          uVar27 = 1L << ((byte)uVar16 & 0x3f);
          if ((local_b0 >> (uVar16 & 0x3f) & 1) != 0) {
            uVar27 = 0;
          }
          uVar24 = uVar24 | uVar27;
        }
        uVar16 = uVar16 + 1;
        puVar21 = puVar21 + 8;
      } while (uVar18 != uVar16);
      goto LAB_001942f1;
    }
    local_60 = (ulong)uVar18;
  }
  else {
LAB_001942f1:
    local_60 = 0x3f;
    if (sVar4 < 0x3f) {
      local_60 = (ulong)uVar18;
    }
    bVar7 = 0 < sVar4;
    if (0 < sVar4) {
      uVar16 = (ulong)((int)local_60 + 3U & 0x7c);
      lVar22 = local_60 - 1;
      auVar35._8_4_ = (int)lVar22;
      auVar35._0_8_ = lVar22;
      auVar35._12_4_ = (int)((ulong)lVar22 >> 0x20);
      auVar38._8_4_ = (int)uVar24;
      auVar38._0_8_ = uVar24;
      auVar38._12_4_ = (int)(uVar24 >> 0x20);
      auVar40 = _DAT_001ff080;
      auVar44 = _DAT_001ff090;
      uVar29 = 0;
      uVar31 = 0;
      uVar34 = 0;
      do {
        uVar33 = uVar34;
        uVar30 = uVar31;
        uVar28 = uVar29;
        uVar25 = uVar26;
        auVar36 = auVar44;
        auVar37 = auVar40;
        uVar45 = 1L << auVar37._0_8_ & uVar24;
        uVar46 = 1L << auVar37._8_8_ & auVar38._8_8_;
        uVar27 = 1L << auVar36._0_8_ & uVar24;
        uVar32 = 1L << auVar36._8_8_ & auVar38._8_8_;
        uVar26 = (uVar25 - ((int)(uVar27 >> 0x20) == 0 && (int)uVar27 == 0)) + 1;
        uVar29 = (uVar28 - ((int)uVar32 == 0 && (int)(uVar32 >> 0x20) == 0)) + 1;
        uVar31 = (uVar30 - ((int)(uVar45 >> 0x20) == 0 && (int)uVar45 == 0)) + 1;
        uVar34 = (uVar33 - ((int)uVar46 == 0 && (int)(uVar46 >> 0x20) == 0)) + 1;
        auVar44._0_8_ = auVar36._0_8_ + 4;
        auVar44._8_8_ = auVar36._8_8_ + 4;
        auVar40._0_8_ = auVar37._0_8_ + 4;
        auVar40._8_8_ = auVar37._8_8_ + 4;
        uVar16 = uVar16 - 4;
      } while (uVar16 != 0);
      auVar35 = auVar35 ^ _DAT_001ff0a0;
      auVar36 = auVar36 ^ _DAT_001ff0a0;
      iVar11 = auVar35._4_4_;
      iVar12 = auVar35._12_4_;
      auVar37 = auVar37 ^ _DAT_001ff0a0;
      uVar39 = -(uint)(iVar11 < auVar36._4_4_ ||
                      auVar36._4_4_ == iVar11 && auVar35._0_4_ < auVar36._0_4_);
      uVar41 = -(uint)(iVar12 < auVar36._12_4_ ||
                      auVar36._12_4_ == iVar12 && auVar35._8_4_ < auVar36._8_4_);
      uVar42 = -(uint)(iVar11 < auVar37._4_4_ ||
                      auVar37._4_4_ == iVar11 && auVar35._0_4_ < auVar37._0_4_);
      uVar43 = -(uint)(iVar12 < auVar37._12_4_ ||
                      auVar37._12_4_ == iVar12 && auVar35._8_4_ < auVar37._8_4_);
      uVar26 = (~uVar43 & uVar34 | uVar33 & uVar43) + (~uVar41 & uVar29 | uVar28 & uVar41) +
               (~uVar42 & uVar31 | uVar30 & uVar42) + (~uVar39 & uVar26 | uVar25 & uVar39);
      goto LAB_00194469;
    }
  }
  bVar7 = false;
LAB_00194469:
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar11 = ((uint)((long)pSrc->colUsed >> 0x3f) & uVar18 - 0x3f) + uVar26;
  uVar16 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(ushort)(-1 < cVar8) + (short)iVar11,0,&local_40);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar5;
    pWVar20 = pWC->a;
    bVar9 = 0;
    if (pWVar20 < pWVar15) {
      bVar9 = 0;
      uVar27 = 0;
      uVar16 = 0;
      do {
        iVar12 = termCanDriveIndex(pWVar20,pSrc,notReady);
        if (iVar12 != 0) {
          iVar12 = (pWVar20->u).x.leftColumn;
          uVar32 = 1L << ((byte)iVar12 & 0x3f);
          if (0x3f < iVar12) {
            uVar32 = 0x8000000000000000;
          }
          if ((uVar32 & uVar27) == 0) {
            pEVar13 = pWVar20->pExpr;
            iVar23 = (int)uVar16;
            pIdx->aiColumn[iVar23] = (i16)iVar12;
            uVar26 = pEVar13->flags & 0x400;
            pCVar14 = sqlite3BinaryCompareCollSeq
                                (pParse,*(Expr **)((long)&pEVar13->pLeft + (ulong)(uVar26 >> 7)),
                                 (&pEVar13->pLeft)[uVar26 == 0]);
            pcVar17 = "BINARY";
            if (pCVar14 != (CollSeq *)0x0) {
              pcVar17 = pCVar14->zName;
            }
            uVar27 = uVar32 | uVar27;
            pIdx->azColl[iVar23] = pcVar17;
            uVar16 = (ulong)(iVar23 + 1);
            if ((pEVar13->pLeft != (Expr *)0x0) &&
               (cVar8 = sqlite3ExprAffinity(pEVar13->pLeft), cVar8 != 'B')) {
              bVar9 = 1;
            }
          }
        }
        pWVar20 = pWVar20 + 1;
      } while (pWVar20 < pWVar15);
    }
    if (bVar7) {
      uVar27 = 0;
      do {
        if ((uVar24 >> (uVar27 & 0x3f) & 1) != 0) {
          iVar12 = (int)uVar16;
          pIdx->aiColumn[iVar12] = (i16)uVar27;
          pIdx->azColl[iVar12] = "BINARY";
          uVar16 = (ulong)(iVar12 + 1);
        }
        uVar27 = uVar27 + 1;
      } while (local_60 != uVar27);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar5->nCol)) {
      uVar16 = (ulong)(int)uVar16;
      iVar12 = 0x3f;
      do {
        pIdx->aiColumn[uVar16] = (i16)iVar12;
        pIdx->azColl[uVar16] = "BINARY";
        uVar16 = uVar16 + 1;
        iVar12 = iVar12 + 1;
      } while (iVar12 < pTVar5->nCol);
    }
    iVar12 = (int)uVar16;
    if ((pTVar5->tabFlags & 0x80) == 0) {
      pIdx->aiColumn[iVar12] = -1;
      pIdx->azColl[iVar12] = "BINARY";
    }
    iVar23 = pParse->nTab;
    pParse->nTab = iVar23 + 1;
    pLevel->iIdxCur = iVar23;
    sqlite3VdbeAddOp3(p,0x74,iVar23,iVar11 + 1,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    if ((bool)((pParse->db->dbOptFlags & 0x80000) == 0 & bVar9)) {
      sqlite3WhereExplainBloomFilter(pParse,(WhereInfo *)pWC->pWInfo->pTabList,pLevel);
      iVar11 = pParse->nMem + 1;
      pParse->nMem = iVar11;
      pLevel->regFilter = iVar11;
      sqlite3VdbeAddOp3(p,0x4d,10000,iVar11,0);
    }
    if (((pSrc->fg).field_0x1 & 0x40) == 0) {
      local_70 = 0;
      iVar11 = sqlite3VdbeAddOp3(p,0x24,pLevel->iTabCur,0,0);
    }
    else {
      pSVar6 = (pSrc->u4).pSubq;
      iVar11 = pSVar6->regReturn;
      iVar23 = sqlite3VdbeAddOp3(p,0x47,0,0,0);
      sqlite3VdbeAddOp3(p,0xb,iVar11,0,pSVar6->addrFillSub);
      iVar11 = sqlite3VdbeAddOp3(p,0xc,iVar11,0,0);
      local_70 = (long)iVar23;
    }
    if (local_b8 == (Expr *)0x0) {
      iVar23 = 0;
    }
    else {
      iVar23 = pParse->nLabel + -1;
      pParse->nLabel = iVar23;
      sqlite3ExprIfFalse(pParse,local_b8,iVar23,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
    }
    if (pParse->nTempReg == '\0') {
      regOut = pParse->nMem + 1;
      pParse->nMem = regOut;
    }
    else {
      bVar9 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar9;
      regOut = pParse->aTempReg[bVar9];
    }
    p3 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,regOut,0,(int *)0x0,(Index *)0x0,0);
    if (pLevel->regFilter != 0) {
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,p3,(uint)(p_00->u).btree.nEq);
    }
    sqlite3VdbeAddOp3(p,0x8a,pLevel->iIdxCur,regOut,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_b8 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar23);
    }
    if (((pSrc->fg).field_0x1 & 0x40) == 0) {
      sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar11 + 1,0);
      iVar12 = p->nOp;
      if (0 < (long)iVar12) {
        p->aOp[(long)iVar12 + -1].p5 = 3;
      }
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar19 = p->aOp + local_70;
      }
      else {
        pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar19->p2 = p3 + iVar12;
      translateColumnToCopy
                (pParse,iVar11,pLevel->iTabCur,((pSrc->u4).pSubq)->regResult,pLevel->iIdxCur);
      sqlite3VdbeAddOp3(p,9,0,iVar11,0);
      puVar2 = &(pSrc->fg).field_0x1;
      *puVar2 = *puVar2 & 0xbf;
      iVar12 = p->nOp;
    }
    uVar3 = p->db->mallocFailed;
    if (uVar3 == '\0') {
      pOVar19 = p->aOp + iVar11;
    }
    else {
      pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar19->p2 = iVar12;
    if (regOut != 0) {
      bVar9 = pParse->nTempReg;
      if ((ulong)bVar9 < 8) {
        pParse->nTempReg = bVar9 + 1;
        pParse->aTempReg[bVar9] = regOut;
        iVar12 = p->nOp;
      }
    }
    if (uVar3 == '\0') {
      pOVar19 = p->aOp + iVar10;
    }
    else {
      pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar19->p2 = iVar12;
  }
LAB_001949f4:
  if (local_b8 == (Expr *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3ExprDeleteNN(pParse->db,local_b8);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warning has been issued */
  u8 useBloomFilter = 0;      /* True to also add a Bloom filter */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcList *pTabList;          /* The complete FROM clause */
  SrcItem *pSrc;              /* The FROM clause term to get the next index */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExp = 0;            /* Address of OP_Explain */
#endif

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTabList = pWC->pWInfo->pTabList;
  pSrc = &pTabList->a[pLevel->iFrom];
  pTable = pSrc->pSTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, pLevel->iFrom, 0)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  if( IsView(pTable) ){
    extraCols = ALLBITS & ~idxCols;
  }else{
    extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  }
  if( !HasRowid(pTable) ){
    /* For WITHOUT ROWID tables, ensure that all PRIMARY KEY columns are
    ** either in the idxCols mask or in the extraCols mask */
    for(i=0; i<pTable->nCol; i++){
      if( (pTable->aCol[i].colFlags & COLFLAG_PRIMKEY)==0 ) continue;
      if( i>=BMS-1 ){
        extraCols |= MASKBIT(BMS-1);
        break;
      }
      if( idxCols & MASKBIT(i) ) continue;
      extraCols |= MASKBIT(i);
    }
  }
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+HasRowid(pTable),
                                    0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
        if( ALWAYS(pX->pLeft!=0)
         && sqlite3ExprAffinity(pX->pLeft)!=SQLITE_AFF_TEXT
        ){
          /* TUNING: only use a Bloom filter on an automatic index
          ** if one or more key columns has the ability to hold numeric
          ** values, since strings all have the same hash in the Bloom
          ** filter implementation and hence a Bloom filter on a text column
          ** is not usually helpful. */
          useBloomFilter = 1;
        }
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  if( HasRowid(pTable) ){
    pIdx->aiColumn[n] = XN_ROWID;
    pIdx->azColl[n] = sqlite3StrBINARY;
  }

  /* Create the automatic index */
  explainAutomaticIndex(pParse, pIdx, pPartial!=0, &addrExp);
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) && useBloomFilter ){
    sqlite3WhereExplainBloomFilter(pParse, pWC->pWInfo, pLevel);
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  assert( pSrc == &pWC->pWInfo->pTabList->a[pLevel->iFrom] );
  if( pSrc->fg.viaCoroutine ){
    int regYield;
    Subquery *pSubq;
    assert( pSrc->fg.isSubquery );
    pSubq = pSrc->u4.pSubq;
    assert( pSubq!=0 );
    regYield = pSubq->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pSubq->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pSrc->pSTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeScanStatusCounters(v, addrExp, addrExp, sqlite3VdbeCurrentAddr(v));
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pSrc->fg.viaCoroutine ){
    assert( pSrc->fg.isSubquery && pSrc->u4.pSubq!=0 );
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pSrc->u4.pSubq->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pSrc->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);
  sqlite3VdbeScanStatusRange(v, addrExp, addrExp, -1);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}